

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xml_node __thiscall pugi::xml_node::previous_sibling(xml_node *this,char_t *name_)

{
  xml_node_struct *pxVar1;
  xml_node_struct *pxVar2;
  int iVar3;
  
  if (this->_root != (xml_node_struct *)0x0) {
    pxVar1 = this->_root->prev_sibling_c;
    pxVar2 = pxVar1->next_sibling;
    while (pxVar2 != (xml_node_struct *)0x0) {
      if ((pxVar1->name != (char *)0x0) && (iVar3 = strcmp(name_,pxVar1->name), iVar3 == 0)) {
        return (xml_node)pxVar1;
      }
      pxVar1 = pxVar1->prev_sibling_c;
      pxVar2 = pxVar1->next_sibling;
    }
  }
  return (xml_node)(xml_node_struct *)0x0;
}

Assistant:

PUGI__FN xml_node xml_node::previous_sibling(const char_t* name_) const
	{
		if (!_root) return xml_node();

		for (xml_node_struct* i = _root->prev_sibling_c; i->next_sibling; i = i->prev_sibling_c)
			if (i->name && impl::strequal(name_, i->name)) return xml_node(i);

		return xml_node();
	}